

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O1

void cf_poly1305_finish(cf_poly1305 *ctx,uint8_t *out)

{
  size_t sVar1;
  int i;
  long lVar2;
  size_t sVar3;
  uint uVar4;
  cf_poly1305 *pcVar5;
  uint32_t *puVar6;
  byte bVar7;
  uint32_t c [17];
  uint32_t s [17];
  uint32_t local_a8 [20];
  uint auStack_58 [18];
  
  bVar7 = 0;
  sVar1 = ctx->npartial;
  if (sVar1 != 0) {
    local_a8[0xc] = 0;
    local_a8[0xd] = 0;
    local_a8[0xe] = 0;
    local_a8[0xf] = 0;
    local_a8[8] = 0;
    local_a8[9] = 0;
    local_a8[10] = 0;
    local_a8[0xb] = 0;
    local_a8[4] = 0;
    local_a8[5] = 0;
    local_a8[6] = 0;
    local_a8[7] = 0;
    local_a8[0] = 0;
    local_a8[1] = 0;
    local_a8[2] = 0;
    local_a8[3] = 0;
    local_a8[0x10] = 0;
    sVar3 = 0;
    do {
      local_a8[sVar3] = (uint)ctx->partial[sVar3];
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
    local_a8[sVar1] = 1;
    poly1305_block(ctx,local_a8);
  }
  lVar2 = 0;
  do {
    auStack_58[lVar2] = (uint)ctx->s[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  auStack_58[0x10] = 0;
  pcVar5 = ctx;
  puVar6 = local_a8;
  for (lVar2 = 0x11; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar6 = pcVar5->h[0];
    pcVar5 = (cf_poly1305 *)((long)pcVar5 + (ulong)bVar7 * -8 + 4);
    puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
  }
  lVar2 = 0;
  uVar4 = 0;
  do {
    uVar4 = uVar4 + *(int *)((long)local_a8 + lVar2) + *(int *)((long)negative_1305 + lVar2);
    *(uint *)((long)local_a8 + lVar2) = uVar4 & 0xff;
    uVar4 = uVar4 >> 8;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x44);
  lVar2 = 0;
  do {
    puVar6 = local_a8 + lVar2;
    if ((char)local_a8[0x10] < '\0') {
      puVar6 = ctx->h + lVar2;
    }
    ctx->h[lVar2] = *puVar6;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x11);
  lVar2 = 0;
  uVar4 = 0;
  do {
    uVar4 = uVar4 + ctx->h[lVar2] + auStack_58[lVar2];
    ctx->h[lVar2] = uVar4 & 0xff;
    uVar4 = uVar4 >> 8;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x11);
  lVar2 = 0;
  do {
    out[lVar2] = (uint8_t)ctx->h[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  memset(ctx,0,0xb0);
  return;
}

Assistant:

void cf_poly1305_finish(cf_poly1305 *ctx,
                        uint8_t out[16])
{
  if (ctx->npartial)
    poly1305_last_block(ctx);

  uint32_t s[17];
  size_t i;
  for (i = 0; i < 16; i++)
    s[i] = ctx->s[i];
  s[16] = 0;

  poly1305_full_reduce(ctx->h);
  poly1305_add(ctx->h, s);

  for (i = 0; i < 16; i++)
    out[i] = ctx->h[i];

  mem_clean(ctx, sizeof *ctx);
}